

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall
pfederc::BiOpExpr::BiOpExpr
          (BiOpExpr *this,Lexer *lexer,Position *pos,Token *tokOp,TokenType opType,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  Expr *pEVar1;
  size_t sVar2;
  bool bVar3;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_BIOP;
  sVar2 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar2;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BiOpExpr_00128998;
  this->tokOp = tokOp;
  this->opType = opType;
  (this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (rhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (rhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  if (this->tokOp == (Token *)0x0) {
    __assert_fail("this->tokOp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x313,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar3 = isTokenTypeOperator(opType);
  if (!bVar3) {
    __assert_fail("isTokenTypeOperator(this->opType)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x314,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  pEVar1 = (this->lhs)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 == (Expr *)0x0) {
    __assert_fail("!!this->lhs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x315,
                  "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
                 );
  }
  if ((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    pEVar1->parent = &this->super_Expr;
    ((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
     .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->parent = &this->super_Expr;
    return;
  }
  __assert_fail("!!this->rhs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x316,
                "pfederc::BiOpExpr::BiOpExpr(const Lexer &, const Position &, const Token *, TokenType, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&)"
               );
}

Assistant:

BiOpExpr::BiOpExpr(const Lexer &lexer, const Position &pos,
     const Token *tokOp,
     TokenType opType,
     std::unique_ptr<Expr> &&lhs, std::unique_ptr<Expr> &&rhs) noexcept
     : Expr(lexer, ExprType::EXPR_BIOP, pos), tokOp{tokOp}, opType{opType},
       lhs(std::move(lhs)), rhs(std::move(rhs)) {
  assert(this->tokOp);
  assert(isTokenTypeOperator(this->opType));
  assert(!!this->lhs);
  assert(!!this->rhs);

  this->lhs->setParent(this);
  this->rhs->setParent(this);
}